

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerTriangles.cpp
# Opt level: O3

RGB __thiscall
RayTracerTriangles::processPixelOnTriangle
          (RayTracerTriangles *this,Point *rayBeg,Point *pointOnTriangle,Triangle *triangle,
          int recursionLevel)

{
  float fVar1;
  bool bVar2;
  RGB RVar3;
  uint uVar4;
  float fVar5;
  undefined1 local_68 [8];
  Segment refl;
  
  bVar2 = pointInShadow(this,pointOnTriangle,triangle);
  RVar3 = colorOfPoint(pointOnTriangle,triangle);
  if (bVar2) {
    fVar1 = (this->super_RayTracerBase).config.super_BaseConfig.ambientCoefficient;
    uVar4 = (int)((float)((uint3)RVar3 & 0xff) * fVar1) & 0xffU |
            ((int)((float)(RVar3._1_2_ & 0xff) * fVar1) & 0xffU) << 8 |
            (int)((float)RVar3.b * fVar1) << 0x10;
  }
  else {
    RVar3 = calculateColorInLight(this,pointOnTriangle,triangle,RVar3);
    uVar4 = (uint)(uint3)RVar3;
  }
  if ((recursionLevel < (this->super_RayTracerBase).config.super_BaseConfig.maxRecursionLevel) &&
     (1.1920929e-07 <= ABS(triangle->reflectionCoefficient))) {
    refl.b.y = rayBeg->x;
    refl.b.z = rayBeg->y;
    randomReflection((Segment *)local_68,(Segment *)&refl.b.y,triangle);
    RVar3 = processPixel(this,(Segment *)local_68,recursionLevel + 1);
    fVar1 = triangle->reflectionCoefficient;
    fVar5 = 1.0 - fVar1;
    uVar4 = (uint)(byte)((char)(int)((float)((uint3)RVar3 & 0xff) * fVar1) +
                        (char)(int)((float)(uVar4 & 0xff) * fVar5)) |
            (uint)(byte)((char)(int)((float)(RVar3._1_2_ & 0xff) * fVar1) +
                        (char)(int)((float)(uVar4 >> 8 & 0xff) * fVar5)) << 8 |
            (uint)(byte)((char)(int)((float)RVar3.b * fVar1) +
                        (char)(int)((float)(uVar4 >> 0x10 & 0xff) * fVar5)) << 0x10;
  }
  return SUB43(uVar4,0);
}

Assistant:

RGB RayTracerTriangles::processPixelOnTriangle(Point const& rayBeg, Point const& pointOnTriangle,
                                               Triangle const& triangle, int recursionLevel)
{
  bool const isInShadow = pointInShadow(pointOnTriangle, triangle);
  RGB color = colorOfPoint(pointOnTriangle, triangle);

  RGB resultCol;
  if (isInShadow)
    resultCol = color * config.ambientCoefficient;
  else
    resultCol = calculateColorInLight(pointOnTriangle, triangle, color);

  if (recursionLevel >= config.maxRecursionLevel || isCloseToZero(triangle.reflectionCoefficient))
    return resultCol;

  Segment refl = randomReflection({rayBeg, pointOnTriangle}, triangle);
  RGB reflectedColor = processPixel(refl, recursionLevel + 1);

  return calculateColorFromReflection(resultCol, reflectedColor, triangle.reflectionCoefficient);
}